

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
hexedit_reader::perform(hexedit_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  pointer puVar1;
  undefined8 *puVar2;
  ReadWriter_ptr wr;
  
  if (1 < g_verbose) {
    printf("dohexedit(%s, %08llx, %08zx)\n",(this->_readername)._M_dataplus._M_p,this->_ofs,
           (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
  }
  readercollection::getbyname((readercollection *)&wr,(string *)rdlist);
  if (wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    (*(wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter[4])
              (wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this->_ofs);
    puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    (*(wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter[3])
              (wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,puVar1,
               (long)(this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&wr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "hexedit: invalid rdname";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dohexedit(%s, %08llx, %08zx)\n", _readername.c_str(), _ofs, _data.size());

        ReadWriter_ptr wr= rdlist.getbyname(_readername);
        if (!wr) throw "hexedit: invalid rdname";
        wr->setpos(_ofs);

        wr->write(&_data[0], _data.size());
    }